

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::ungetEnterVal
          (SPxSolverBase<double> *this,SPxId enterId,Status enterStat,double leaveVal,
          SVectorBase<double> *vec,StableSum<double> *objChange)

{
  double dVar1;
  pointer pdVar2;
  DataArray<int> *pDVar3;
  int iVar4;
  ulong uVar5;
  VectorBase<double> *pVVar6;
  long lVar7;
  int *piVar8;
  Status SVar9;
  double dVar10;
  double dVar11;
  DataKey local_48;
  double local_40;
  DataKey local_38;
  
  SVar9 = (uint)(enterStat != P_ON_UPPER) * 2 | P_ON_LOWER;
  local_48 = enterId.super_DataKey;
  local_40 = leaveVal;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_48);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_38);
    (this->super_SPxBasisBase<double>).thedesc.rowstat.data[iVar4] = SVar9;
    pVVar6 = &this->theURbound;
    if (enterStat != P_ON_UPPER) {
      pVVar6 = &this->theLRbound;
    }
    dVar10 = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4] *
             (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar4];
    dVar1 = objChange->sum;
    dVar11 = dVar1 + dVar10;
    objChange->c = (dVar10 - (dVar11 - dVar1)) + (dVar1 - (dVar11 - (dVar11 - dVar1))) +
                   objChange->c;
    objChange->sum = dVar11;
    pdVar2 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[iVar4] = local_40 + pdVar2[iVar4];
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_38,(SPxId *)&local_48);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_38);
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar4] = SVar9;
    pVVar6 = &this->theLCbound;
    if (enterStat != P_ON_UPPER) {
      pVVar6 = &this->theUCbound;
    }
    dVar10 = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4] *
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar4];
    dVar1 = objChange->sum;
    dVar11 = dVar1 + dVar10;
    objChange->c = (dVar10 - (dVar11 - dVar1)) + (dVar1 - (dVar11 - (dVar11 - dVar1))) +
                   objChange->c;
    objChange->sum = dVar11;
    lVar7 = (long)vec->memused;
    if (0 < lVar7) {
      pdVar2 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = lVar7 + 1;
      piVar8 = &vec->m_elem[lVar7 + -1].idx;
      do {
        pdVar2[*piVar8] = ((Nonzero<double> *)(piVar8 + -2))->val * local_40 + pdVar2[*piVar8];
        uVar5 = uVar5 - 1;
        piVar8 = piVar8 + -4;
      } while (1 < uVar5);
    }
  }
  local_48.info = this->theRep * local_48.info;
  pVVar6 = &this->theCoTest;
  if (0 < local_48.info) {
    pVVar6 = &this->theTest;
  }
  (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar4] = 0.0;
  pDVar3 = &this->isInfeasibleCo;
  if (local_48.info < 1) {
    pDVar3 = &this->isInfeasible;
  }
  pDVar3->data[iVar4] = 0;
  return;
}

Assistant:

void
SPxSolverBase<R>::ungetEnterVal(
   SPxId enterId,
   typename SPxBasisBase<R>::Desc::Status enterStat,
   R leaveVal,
   const SVectorBase<R>& vec,
   StableSum<R>& objChange
)
{
   assert(rep() == COLUMN);
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += theLCbound[enterIdx] * this->maxObj(enterIdx);
      }
      else
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += theUCbound[enterIdx] * this->maxObj(enterIdx);
      }

      theFrhs->multAdd(leaveVal, vec);
   }
   else
   {
      enterIdx = this->number(SPxRowId(enterId));
      assert(enterId.isSPxRowId());

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += (theURbound[enterIdx]) * this->maxRowObj(enterIdx);
      }
      else
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += (theLRbound[enterIdx]) * this->maxRowObj(enterIdx);
      }

      (*theFrhs)[enterIdx] += leaveVal;
   }

   if(isId(enterId))
   {
      theTest[enterIdx] = 0;
      isInfeasibleCo[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
   else
   {
      theCoTest[enterIdx] = 0;
      isInfeasible[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
}